

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void __thiscall
boost::deflate::inflate_stream_test::Matrix::operator()(Matrix *this,Boost *f,string *check)

{
  bool bVar1;
  int level;
  uint uVar2;
  int memLevel;
  int in_stack_ffffffffffffff90;
  string local_60;
  IDecompressor local_40;
  Bytef *local_38;
  
  if (this->level_[0] <= this->level_[1]) {
    uVar2 = this->level_[0];
    do {
      level = this->window_[0];
      if (this->window_[0] <= this->window_[1]) {
        do {
          memLevel = this->strategy_[0];
          if (this->strategy_[0] <= this->strategy_[1]) {
            do {
              local_40._vptr_IDecompressor = (_func_int **)(check->_M_dataplus)._M_p;
              local_38 = (Bytef *)check->_M_string_length;
              compress_abi_cxx11_(&local_60,(inflate_stream_test *)&stack0xffffffffffffffc0,
                                  (string_view *)(ulong)uVar2,level,0,4,memLevel,
                                  in_stack_ffffffffffffff90);
              Boost::operator()(f,level,&local_60,check);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              bVar1 = memLevel < this->strategy_[1];
              memLevel = memLevel + 1;
            } while (bVar1);
          }
          bVar1 = level < this->window_[1];
          level = level + 1;
        } while (bVar1);
      }
      bVar1 = (int)uVar2 < this->level_[1];
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void operator()(
            F const& f,
            std::string const& check) const
        {
            for(auto level = level_[0];
                level <= level_[1]; ++level)
            {
                for(auto window = window_[0];
                    window <= window_[1]; ++window)
                {
                    for(auto strategy = strategy_[0];
                        strategy <= strategy_[1]; ++strategy)
                        f(
                            window,
                            compress(check, level, window,boost::deflate::wrap::none, 4, strategy),
                            check);
                }
            }
        }